

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O0

Option * __thiscall
despot::PlannerBase::InitializeParamers
          (PlannerBase *this,int argc,char **argv,string *solver_type,bool *search_solver,
          int *num_runs,string *world_type,string *belief_type,int *time_limit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  Option *pOVar5;
  ostream *poVar6;
  int argc_00;
  Option *local_f0;
  Option *local_c0;
  Stats local_a0;
  Random local_90;
  uint local_8c;
  undefined1 local_88 [4];
  uint seed;
  Parser parse;
  Option *buffer;
  Option *options;
  Stats stats;
  char *program;
  int *num_runs_local;
  bool *search_solver_local;
  string *solver_type_local;
  char **argv_local;
  int argc_local;
  PlannerBase *this_local;
  
  EvalLog::curr_inst_start_time = get_time_second();
  if (argc < 1) {
    local_a0 = (Stats)0x237123;
  }
  else {
    local_a0 = (Stats)*argv;
  }
  stats = local_a0;
  argc_00 = argc - (uint)(0 < argc);
  option::Stats::Stats
            ((Stats *)&options,this->usage,argc_00,argv + (int)(uint)(0 < argc_00),0,false);
  uVar3 = CONCAT44(0,options._4_4_);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x30),0);
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  this_local = (PlannerBase *)operator_new__(uVar4);
  if (uVar3 != 0) {
    local_c0 = (Option *)this_local;
    do {
      option::Option::Option(local_c0);
      local_c0 = local_c0 + 1;
    } while (local_c0 != (Option *)((long)this_local + uVar3 * 0x30));
  }
  uVar3 = CONCAT44(0,(uint)options);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  uVar4 = SUB168(auVar2 * ZEXT816(0x30),0);
  if (SUB168(auVar2 * ZEXT816(0x30),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  parse._16_8_ = operator_new__(uVar4);
  if (uVar3 != 0) {
    local_f0 = (Option *)parse._16_8_;
    do {
      option::Option::Option(local_f0);
      local_f0 = local_f0 + 1;
    } while (local_f0 != (Option *)(parse._16_8_ + uVar3 * 0x30));
  }
  option::Parser::Parser
            ((Parser *)local_88,this->usage,argc_00,argv + (int)(uint)(0 < argc_00),
             (Option *)this_local,(Option *)parse._16_8_,0,false,-1);
  (*this->_vptr_PlannerBase[4])();
  pOVar5 = option::Option::operator_cast_to_Option_((Option *)((long)this_local + 0x30));
  if (pOVar5 == (Option *)0x0) {
    OptionParse(this,(Option *)this_local,num_runs,world_type,belief_type,time_limit,solver_type,
                search_solver);
    Seeds::root_seed(DAT_00278a90);
    local_8c = Seeds::Next();
    Random::Random(&local_90,local_8c);
    Random::RANDOM = local_90.seed_;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar6 = std::operator<<(poVar6,(char *)stats);
    poVar6 = std::operator<<(poVar6," [options]");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    option::printUsage<std::ostream>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,this->usage,0x50,0x32,0x4b
              );
    this_local = (PlannerBase *)0x0;
  }
  return (Option *)this_local;
}

Assistant:

option::Option* PlannerBase::InitializeParamers(int argc, char *argv[],
		std::string& solver_type, bool& search_solver, int& num_runs,
		std::string& world_type, std::string& belief_type, int& time_limit) {
	EvalLog::curr_inst_start_time = get_time_second();

	const char *program = (argc > 0) ? argv[0] : "despot";

	argc -= (argc > 0);
	argv += (argc > 0); // skip program name argv[0] if present

	option::Stats stats(usage, argc, argv);
	option::Option *options = new option::Option[stats.options_max];
	option::Option *buffer = new option::Option[stats.buffer_max];
	option::Parser parse(usage, argc, argv, options, buffer);

	/* =========================================
	 * Problem specific default parameter values
	 *=========================================*/
	InitializeDefaultParameters();

	/* =========================
	 * Parse optional parameters
	 * =========================*/
	if (options[E_HELP]) {
		cout << "Usage: " << program << " [options]" << endl;
		option::printUsage(std::cout, usage);
		return NULL;
	}
	OptionParse(options, num_runs, world_type, belief_type, time_limit,
			solver_type, search_solver);

	/* =========================
	 * Global random generator
	 * =========================*/
	Seeds::root_seed(Globals::config.root_seed);
	//unsigned world_seed = Seeds::Next();
	unsigned seed = Seeds::Next();
	Random::RANDOM = Random(seed);

	return options;
}